

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseImportModuleField(WastParser *this,Module *module)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  Result RVar2;
  TokenType TVar3;
  pointer pFVar4;
  pointer pFVar5;
  pointer pTVar6;
  pointer pMVar7;
  pointer pGVar8;
  pointer pEVar9;
  pointer pIVar10;
  pointer pIVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_390;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_368;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_35a;
  allocator local_359;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  iterator local_338;
  size_type local_330;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_310;
  Enum local_304;
  Enum local_300;
  Enum local_2fc;
  unique_ptr<wabt::EventImport,_std::default_delete<wabt::EventImport>_> local_2f8;
  unique_ptr<wabt::EventImport,_std::default_delete<wabt::EventImport>_> import_4;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_2b0;
  Enum local_2a8;
  Enum local_2a4;
  unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> local_2a0;
  unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> import_3;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_258;
  Enum local_24c;
  Enum local_248;
  Enum local_244;
  unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> local_240;
  unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> import_2;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_1f8;
  Enum local_1ec;
  Enum local_1e8;
  Enum local_1e4;
  unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> local_1e0;
  unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> import_1;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_198;
  Enum local_190;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18b;
  allocator local_18a;
  allocator local_189;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string asStack_168 [32];
  iterator local_148;
  size_type local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  Enum local_120;
  Enum local_11c;
  Enum local_118;
  Enum local_114;
  unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> local_110;
  unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> import;
  undefined1 local_c8 [8];
  string name;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> field;
  int local_98;
  undefined1 local_90 [8];
  string field_name;
  string module_name;
  undefined1 local_48 [8];
  Location loc;
  Module *module_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  GetLocation((Location *)local_48,this);
  CheckImportOrdering(this,module);
  RVar2 = Expect(this,Import);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  std::__cxx11::string::string((string *)(field_name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_90);
  RVar2 = ParseQuotedText(this,(string *)((long)&field_name.field_2 + 8));
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    goto LAB_003204b6;
  }
  RVar2 = ParseQuotedText(this,(string *)local_90);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    goto LAB_003204b6;
  }
  RVar2 = Expect(this,Lpar);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    goto LAB_003204b6;
  }
  std::unique_ptr<wabt::ImportModuleField,std::default_delete<wabt::ImportModuleField>>::
  unique_ptr<std::default_delete<wabt::ImportModuleField>,void>
            ((unique_ptr<wabt::ImportModuleField,std::default_delete<wabt::ImportModuleField>> *)
             (name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_c8);
  TVar3 = Peek(this,0);
  if (TVar3 == Event) {
    Consume((Token *)&import_4,this);
    ParseBindVarOpt(this,(string *)local_c8);
    MakeUnique<wabt::EventImport,std::__cxx11::string&>
              ((wabt *)&local_2f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
    pEVar9 = std::unique_ptr<wabt::EventImport,_std::default_delete<wabt::EventImport>_>::operator->
                       (&local_2f8);
    local_2fc = (Enum)ParseTypeUseOpt(this,&(pEVar9->event).decl);
    bVar1 = Failed((Result)local_2fc);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_98 = 1;
    }
    else {
      pEVar9 = std::unique_ptr<wabt::EventImport,_std::default_delete<wabt::EventImport>_>::
               operator->(&local_2f8);
      local_300 = (Enum)ParseUnboundFuncSignature(this,&(pEVar9->event).decl.sig);
      bVar1 = Failed((Result)local_300);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_98 = 1;
      }
      else {
        local_304 = (Enum)Expect(this,Rpar);
        bVar1 = Failed((Result)local_304);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_98 = 1;
        }
        else {
          MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::EventImport,std::default_delete<wabt::EventImport>>,wabt::Location&>
                    ((wabt *)&local_310,&local_2f8,(Location *)local_48);
          std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
          operator=((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                     *)((long)&name.field_2 + 8),&local_310);
          std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
          ~unique_ptr(&local_310);
          local_98 = 0xc;
        }
      }
    }
    std::unique_ptr<wabt::EventImport,_std::default_delete<wabt::EventImport>_>::~unique_ptr
              (&local_2f8);
joined_r0x0031ffd0:
    if (local_98 == 0xc) {
      pIVar10 = std::
                unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
                operator->((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                            *)((long)&name.field_2 + 8));
      pIVar11 = std::unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>::operator->
                          (&pIVar10->import);
      std::__cxx11::string::operator=
                ((string *)&pIVar11->module_name,(string *)(field_name.field_2._M_local_buf + 8));
      pIVar10 = std::
                unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
                operator->((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                            *)((long)&name.field_2 + 8));
      pIVar11 = std::unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>::operator->
                          (&pIVar10->import);
      std::__cxx11::string::operator=((string *)&pIVar11->field_name,(string *)local_90);
      std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
      unique_ptr(&local_368,
                 (unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                  *)((long)&name.field_2 + 8));
      Module::AppendField(module,&local_368);
      std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
      ~unique_ptr(&local_368);
      RVar2 = Expect(this,Rpar);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        Result::Result((Result *)((long)&this_local + 4),Ok);
      }
    }
  }
  else {
    if (TVar3 == Global) {
      Consume((Token *)&import_3,this);
      ParseBindVarOpt(this,(string *)local_c8);
      MakeUnique<wabt::GlobalImport,std::__cxx11::string&>
                ((wabt *)&local_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
      pGVar8 = std::unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>::
               operator->(&local_2a0);
      local_2a4 = (Enum)ParseGlobalType(this,&pGVar8->global);
      bVar1 = Failed((Result)local_2a4);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_98 = 1;
      }
      else {
        local_2a8 = (Enum)Expect(this,Rpar);
        bVar1 = Failed((Result)local_2a8);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_98 = 1;
        }
        else {
          MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::GlobalImport,std::default_delete<wabt::GlobalImport>>,wabt::Location&>
                    ((wabt *)&local_2b0,&local_2a0,(Location *)local_48);
          std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
          operator=((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                     *)((long)&name.field_2 + 8),&local_2b0);
          std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
          ~unique_ptr(&local_2b0);
          local_98 = 0xc;
        }
      }
      std::unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>::~unique_ptr
                (&local_2a0);
      goto joined_r0x0031ffd0;
    }
    if (TVar3 == Memory) {
      Consume((Token *)&import_2,this);
      ParseBindVarOpt(this,(string *)local_c8);
      MakeUnique<wabt::MemoryImport,std::__cxx11::string&>
                ((wabt *)&local_240,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
      pMVar7 = std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::
               operator->(&local_240);
      local_244 = (Enum)ParseLimitsIndex(this,&(pMVar7->memory).page_limits);
      bVar1 = Failed((Result)local_244);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_98 = 1;
      }
      else {
        pMVar7 = std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::
                 operator->(&local_240);
        local_248 = (Enum)ParseLimits(this,&(pMVar7->memory).page_limits);
        bVar1 = Failed((Result)local_248);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_98 = 1;
        }
        else {
          local_24c = (Enum)Expect(this,Rpar);
          bVar1 = Failed((Result)local_24c);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_98 = 1;
          }
          else {
            MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::MemoryImport,std::default_delete<wabt::MemoryImport>>,wabt::Location&>
                      ((wabt *)&local_258,&local_240,(Location *)local_48);
            std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
            ::operator=((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                         *)((long)&name.field_2 + 8),&local_258);
            std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
            ::~unique_ptr(&local_258);
            local_98 = 0xc;
          }
        }
      }
      std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::~unique_ptr
                (&local_240);
      goto joined_r0x0031ffd0;
    }
    if (TVar3 == Table) {
      Consume((Token *)&import_1,this);
      ParseBindVarOpt(this,(string *)local_c8);
      MakeUnique<wabt::TableImport,std::__cxx11::string&>
                ((wabt *)&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
      pTVar6 = std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::
               operator->(&local_1e0);
      local_1e4 = (Enum)ParseLimits(this,&(pTVar6->table).elem_limits);
      bVar1 = Failed((Result)local_1e4);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_98 = 1;
      }
      else {
        pTVar6 = std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::
                 operator->(&local_1e0);
        local_1e8 = (Enum)ParseRefType(this,&(pTVar6->table).elem_type);
        bVar1 = Failed((Result)local_1e8);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_98 = 1;
        }
        else {
          local_1ec = (Enum)Expect(this,Rpar);
          bVar1 = Failed((Result)local_1ec);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_98 = 1;
          }
          else {
            MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::TableImport,std::default_delete<wabt::TableImport>>,wabt::Location&>
                      ((wabt *)&local_1f8,&local_1e0,(Location *)local_48);
            std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
            ::operator=((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                         *)((long)&name.field_2 + 8),&local_1f8);
            std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
            ::~unique_ptr(&local_1f8);
            local_98 = 0xc;
          }
        }
      }
      std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::~unique_ptr
                (&local_1e0);
      goto joined_r0x0031ffd0;
    }
    if (TVar3 == First_RefKind) {
      Consume((Token *)&import,this);
      ParseBindVarOpt(this,(string *)local_c8);
      MakeUnique<wabt::FuncImport,std::__cxx11::string&>
                ((wabt *)&local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
      bVar1 = PeekMatchLpar(this,Type);
      if (bVar1) {
        pFVar4 = std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::
                 operator->(&local_110);
        (pFVar4->func).decl.has_func_type = true;
        pFVar4 = std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::
                 operator->(&local_110);
        local_114 = (Enum)ParseTypeUseOpt(this,&(pFVar4->func).decl);
        bVar1 = Failed((Result)local_114);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_98 = 1;
        }
        else {
          local_118 = (Enum)Expect(this,Rpar);
          bVar1 = Failed((Result)local_118);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_98 = 1;
          }
          else {
LAB_0031fc49:
            MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::FuncImport,std::default_delete<wabt::FuncImport>>,wabt::Location&>
                      ((wabt *)&local_198,&local_110,(Location *)local_48);
            std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
            ::operator=((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                         *)((long)&name.field_2 + 8),&local_198);
            std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
            ::~unique_ptr(&local_198);
            local_98 = 0xc;
          }
        }
      }
      else {
        pFVar4 = std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::
                 operator->(&local_110);
        pFVar5 = std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::
                 operator->(&local_110);
        local_11c = (Enum)ParseFuncSignature(this,&(pFVar4->func).decl.sig,&(pFVar5->func).bindings)
        ;
        bVar1 = Failed((Result)local_11c);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_98 = 1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_188,"param",&local_189);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(asStack_168,"result",&local_18a);
          local_148 = &local_188;
          local_140 = 2;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator(&local_18b);
          __l_00._M_len = local_140;
          __l_00._M_array = local_148;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_138,__l_00,&local_18b);
          local_120 = (Enum)ErrorIfLpar(this,&local_138,(char *)0x0);
          bVar1 = Failed((Result)local_120);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_138);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator(&local_18b);
          local_390 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_148;
          do {
            local_390 = local_390 + -1;
            std::__cxx11::string::~string((string *)local_390);
          } while (local_390 != &local_188);
          std::allocator<char>::~allocator((allocator<char> *)&local_18a);
          std::allocator<char>::~allocator((allocator<char> *)&local_189);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_98 = 1;
          }
          else {
            local_190 = (Enum)Expect(this,Rpar);
            bVar1 = Failed((Result)local_190);
            if (!bVar1) goto LAB_0031fc49;
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_98 = 1;
          }
        }
      }
      std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::~unique_ptr
                (&local_110);
      goto joined_r0x0031ffd0;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_358,"an external kind",&local_359);
    local_338 = &local_358;
    local_330 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_35a);
    __l._M_len = local_330;
    __l._M_array = local_338;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_328,__l,&local_35a);
    this_local._4_4_ = ErrorExpected(this,&local_328,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_328);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_35a);
    local_3b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_338;
    do {
      local_3b8 = local_3b8 + -1;
      std::__cxx11::string::~string((string *)local_3b8);
    } while (local_3b8 != &local_358);
    std::allocator<char>::~allocator((allocator<char> *)&local_359);
  }
  std::__cxx11::string::~string((string *)local_c8);
  std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
  ~unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> *)
              ((long)&name.field_2 + 8));
LAB_003204b6:
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)(field_name.field_2._M_local_buf + 8));
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseImportModuleField(Module* module) {
  WABT_TRACE(ParseImportModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  CheckImportOrdering(module);
  EXPECT(Import);
  std::string module_name;
  std::string field_name;
  CHECK_RESULT(ParseQuotedText(&module_name));
  CHECK_RESULT(ParseQuotedText(&field_name));
  EXPECT(Lpar);

  std::unique_ptr<ImportModuleField> field;
  std::string name;

  switch (Peek()) {
    case TokenType::Func: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = MakeUnique<FuncImport>(name);
      if (PeekMatchLpar(TokenType::Type)) {
        import->func.decl.has_func_type = true;
        CHECK_RESULT(ParseTypeUseOpt(&import->func.decl));
        EXPECT(Rpar);
      } else {
        CHECK_RESULT(
            ParseFuncSignature(&import->func.decl.sig, &import->func.bindings));
        CHECK_RESULT(ErrorIfLpar({"param", "result"}));
        EXPECT(Rpar);
      }
      field = MakeUnique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Table: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = MakeUnique<TableImport>(name);
      CHECK_RESULT(ParseLimits(&import->table.elem_limits));
      CHECK_RESULT(ParseRefType(&import->table.elem_type));
      EXPECT(Rpar);
      field = MakeUnique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Memory: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = MakeUnique<MemoryImport>(name);
      CHECK_RESULT(ParseLimitsIndex(&import->memory.page_limits));
      CHECK_RESULT(ParseLimits(&import->memory.page_limits));
      EXPECT(Rpar);
      field = MakeUnique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Global: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = MakeUnique<GlobalImport>(name);
      CHECK_RESULT(ParseGlobalType(&import->global));
      EXPECT(Rpar);
      field = MakeUnique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Event: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = MakeUnique<EventImport>(name);
      CHECK_RESULT(ParseTypeUseOpt(&import->event.decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&import->event.decl.sig));
      EXPECT(Rpar);
      field = MakeUnique<ImportModuleField>(std::move(import), loc);
      break;
    }

    default:
      return ErrorExpected({"an external kind"});
  }

  field->import->module_name = module_name;
  field->import->field_name = field_name;

  module->AppendField(std::move(field));
  EXPECT(Rpar);
  return Result::Ok;
}